

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_s2sendump.c
# Opt level: O0

void senone_dump(model_def_t *mdef,senone_t *s,char *file)

{
  mixw_t *pmVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  void *__ptr;
  uint local_474;
  uint local_470;
  int lpmax;
  int pmax;
  int d2;
  int d;
  int n_emit_state;
  senprob_t *sp;
  int32 lut [256];
  FILE *fpout;
  mixw_t *fw;
  int32 se;
  int32 sb;
  int32 p;
  int32 n;
  int32 f;
  int32 m;
  int32 c;
  int32 k;
  int32 j;
  int32 i;
  char *file_local;
  senone_t *s_local;
  model_def_t *mdef_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
          ,99,"Writing S2 format sendump file: %s\n",file);
  lut._1016_8_ = fopen(file,"wb");
  if ((FILE *)lut._1016_8_ == (FILE *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
            ,0x65,"fopen(%s,wb) failed\n",file);
    exit(1);
  }
  for (k = 0; fmtdesc[k] != (char *)0x0; k = k + 1) {
    sVar4 = strlen(fmtdesc[k]);
    iVar2 = (int)sVar4 + 1;
    fwrite_int32((FILE *)lut._1016_8_,iVar2);
    fwrite(fmtdesc[k],1,(long)iVar2,(FILE *)lut._1016_8_);
  }
  fwrite_int32((FILE *)lut._1016_8_,0);
  if (s->n_mgau != 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
            ,0x73,"#codebooks(%d) != 1\n",(ulong)s->n_mgau);
    exit(1);
  }
  if (s->mgau2sen->n_sen != s->n_sen) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
            ,0x76,"#senones for mgau[0](%d) != total #senones(%d)\n",(ulong)(uint)s->mgau2sen->n_sen
            ,(ulong)s->n_sen);
    exit(1);
  }
  if (s->n_feat != 4) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
            ,0x78,"#Features(%d) != 4\n",(ulong)s->n_feat);
    exit(1);
  }
  for (k = 0; (uint)k < s->n_feat; k = k + 1) {
    if (s->mgau2sen->feat_mixw[k].n_wt != s->mgau2sen->feat_mixw->n_wt) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
              ,0x7b,"#Wts not same for all features\n");
      exit(1);
    }
  }
  if (s->mgau2sen->feat_mixw->n_wt != 0x100) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
            ,0x7e,"#Wts(%d) != 256\n",(ulong)(uint)s->mgau2sen->feat_mixw->n_wt);
    exit(1);
  }
  fwrite_int32((FILE *)lut._1016_8_,s->mgau2sen->feat_mixw->n_wt);
  fwrite_int32((FILE *)lut._1016_8_,s->n_sen);
  for (k = 0; k < 0x100; k = k + 1) {
    lut[(long)k + -2] = -(k << ((byte)s->shift & 0x1f));
  }
  __ptr = __ckd_calloc__((ulong)s->n_sen,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
                         ,0x87);
  if (mdef->max_n_state != 6) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
            ,0x8c,"#States(%d) != 5\n",(ulong)(mdef->max_n_state - 1));
    exit(1);
  }
  iVar2 = mdef->max_n_state - 1;
  p = 0;
  do {
    if (s->n_feat <= (uint)p) {
      fclose((FILE *)lut._1016_8_);
      return;
    }
    pmVar1 = s->mgau2sen->feat_mixw;
    for (f = 0; f < pmVar1[p].n_wt; f = f + 1) {
      m = 0;
      pmax = mdef->acmod_set->n_ci;
      local_474 = mdef->acmod_set->n_ci * iVar2 - 1;
      for (se = 0; k = local_474, (uint)se < mdef->acmod_set->n_ci; se = se + 1) {
        local_470 = local_474;
        while (mdef->defn[pmax].tmat == se) {
          for (lpmax = 0; lpmax < iVar2; lpmax = lpmax + 1) {
            if (local_470 < mdef->defn[pmax].state[lpmax]) {
              local_470 = mdef->defn[pmax].state[lpmax];
            }
          }
          pmax = pmax + 1;
        }
        local_474 = local_470;
        while (k = k + 1, k <= (int)local_470) {
          if (s->sen2mgau[k] != 0) {
            __assert_fail("m == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
                          ,0xa6,
                          "void senone_dump(const model_def_t *, const senone_t *, const char *)");
          }
          if (s->mgau2sen_idx[k] != k) {
            __assert_fail("j == i",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
                          ,0xa8,
                          "void senone_dump(const model_def_t *, const senone_t *, const char *)");
          }
          *(senprob_t *)((long)__ptr + (long)m) = pmVar1[p].prob[(int)s->mgau2sen_idx[k]][f];
          m = m + 1;
        }
        k = se * iVar2;
        iVar3 = k + iVar2;
        for (; k <= iVar3 + -1; k = k + 1) {
          if (s->sen2mgau[k] != 0) {
            __assert_fail("m == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
                          ,0xb3,
                          "void senone_dump(const model_def_t *, const senone_t *, const char *)");
          }
          if (s->mgau2sen_idx[k] != k) {
            __assert_fail("j == i",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
                          ,0xb5,
                          "void senone_dump(const model_def_t *, const senone_t *, const char *)");
          }
          *(senprob_t *)((long)__ptr + (long)m) = pmVar1[p].prob[(int)s->mgau2sen_idx[k]][f];
          m = m + 1;
        }
      }
      if (m != mdef->n_tied_state) {
        __assert_fail("k == mdef->n_tied_state",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_s2sendump/mk_s2sendump.c"
                      ,0xba,"void senone_dump(const model_def_t *, const senone_t *, const char *)")
        ;
      }
      for (k = 0; k < 0x100; k = k + 1) {
        fwrite_int32((FILE *)lut._1016_8_,lut[(long)k + -2]);
      }
      fwrite(__ptr,1,(ulong)s->n_sen,(FILE *)lut._1016_8_);
    }
    p = p + 1;
  } while( true );
}

Assistant:

static void senone_dump (const model_def_t *mdef, const senone_t *s, const char *file)
{
    int32 i, j, k, c, m, f, n, p, sb, se;
    mixw_t *fw;
    FILE *fpout;
    int32 lut[256];
    senprob_t *sp;
    int n_emit_state,d,d2,pmax,lpmax;
    
    E_INFO("Writing S2 format sendump file: %s\n", file);
    if ((fpout = fopen(file, "wb")) == NULL)
	E_FATAL("fopen(%s,wb) failed\n", file);
    
    /* Write format description into header */
    for (i = 0; fmtdesc[i] != NULL; i++) {
	n = strlen(fmtdesc[i])+1;
	fwrite_int32 (fpout, n);
	fwrite (fmtdesc[i], sizeof(char), n, fpout);
    }

    /* Terminate header */
    fwrite_int32 (fpout, 0);

    /* Write #codewords, #pdfs */
    if (s->n_mgau != 1)
	E_FATAL("#codebooks(%d) != 1\n", s->n_mgau);
    if (s->mgau2sen[0].n_sen != s->n_sen)
	E_FATAL("#senones for mgau[0](%d) != total #senones(%d)\n",
		s->mgau2sen[0].n_sen, s->n_sen);
    if (s->n_feat != 4)
	E_FATAL("#Features(%d) != 4\n", s->n_feat);
    for (i = 0; i < s->n_feat; i++) {
	if (s->mgau2sen[0].feat_mixw[i].n_wt != s->mgau2sen[0].feat_mixw[0].n_wt)
	    E_FATAL("#Wts not same for all features\n");
    }
    if (s->mgau2sen[0].feat_mixw[0].n_wt != 256)
	E_FATAL("#Wts(%d) != 256\n", s->mgau2sen[0].feat_mixw[0].n_wt);
    
    fwrite_int32 (fpout, s->mgau2sen[0].feat_mixw[0].n_wt);
    fwrite_int32 (fpout, s->n_sen);

    /* Create lut */
    for (i = 0; i < 256; i++)
	lut[i] = -(i << s->shift);
    
    sp = (senprob_t *) ckd_calloc (s->n_sen, sizeof(senprob_t));

    /* Write PDFs (#feat x #wt x #sen) */
    if (mdef->max_n_state - 1 != 5)

	E_FATAL("#States(%d) != 5\n", mdef->max_n_state - 1);
    n_emit_state = mdef->max_n_state - 1;
    for (f = 0; f < s->n_feat; f++) {
	fw = s->mgau2sen[0].feat_mixw;

	for (c = 0; c < fw[f].n_wt; c++) {
	    /*
	     * In S3, all CI-senones (for all CI-phones) come first.  CD-senones later.
	     * But in S2, for each CI-phone, CD-senones come first and then CI-senones.
	     */
	    k = 0, d=mdef->acmod_set->n_ci;
	    lpmax = mdef->acmod_set->n_ci * n_emit_state - 1;
	    for (p = 0; p < mdef->acmod_set->n_ci; p++) {
		/* CD senones first; find start and end points in S3 data */
		for (pmax = lpmax ; mdef->defn[d].tmat == p; d++)
		{
		    for (d2=0; d2 < n_emit_state; d2++)
			if (mdef->defn[d].state[d2] > pmax)
			    pmax = mdef->defn[d].state[d2];
		}
		sb = lpmax + 1;
		se = pmax;
		lpmax = pmax;
		
		for (i = sb; i <= se; i++) {
		    m = s->sen2mgau[i];
		    assert (m == 0);
		    j = s->mgau2sen_idx[i];
		    assert (j == i);
		    
		    sp[k++] = fw[f].prob[j][c];
		}

		/* CI senones next */
		sb = p * n_emit_state;
		se = sb + n_emit_state - 1;
		
		for (i = sb; i <= se; i++) {
		    m = s->sen2mgau[i];
		    assert (m == 0);
		    j = s->mgau2sen_idx[i];
		    assert (j == i);
		    
		    sp[k++] = fw[f].prob[j][c];
		}
	    }
	    assert (k == mdef->n_tied_state);
	    
	    /* Write lut for feat f, codeword c */
	    for (i = 0; i < 256; i++)
		fwrite_int32 (fpout, lut[i]);

	    /* Write data for feat f, codeword c */
	    fwrite (sp, sizeof(uint8), s->n_sen, fpout);
	}
    }

    fclose (fpout);
}